

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O0

void lysc_must_free(lysf_ctx *ctx,lysc_must *must)

{
  void *local_30;
  void *local_20;
  uint64_t c__;
  lysc_must *must_local;
  lysf_ctx *ctx_local;
  
  if (must != (lysc_must *)0x0) {
    lyxp_expr_free(ctx->ctx,must->cond);
    ly_free_prefix_data(LY_VALUE_SCHEMA_RESOLVED,must->prefixes);
    lydict_remove(ctx->ctx,must->emsg);
    lydict_remove(ctx->ctx,must->eapptag);
    lydict_remove(ctx->ctx,must->dsc);
    lydict_remove(ctx->ctx,must->ref);
    local_20 = (void *)0x0;
    while( true ) {
      if (must->exts == (lysc_ext_instance *)0x0) {
        local_30 = (void *)0x0;
      }
      else {
        local_30 = must->exts[-1].compiled;
      }
      if (local_30 <= local_20) break;
      lysc_ext_instance_free(ctx,must->exts + (long)local_20);
      local_20 = (void *)((long)local_20 + 1);
    }
    if (must->exts != (lysc_ext_instance *)0x0) {
      free(&must->exts[-1].compiled);
    }
  }
  return;
}

Assistant:

static void
lysc_must_free(struct lysf_ctx *ctx, struct lysc_must *must)
{
    if (!must) {
        return;
    }

    lyxp_expr_free(ctx->ctx, must->cond);
    ly_free_prefix_data(LY_VALUE_SCHEMA_RESOLVED, must->prefixes);
    lydict_remove(ctx->ctx, must->emsg);
    lydict_remove(ctx->ctx, must->eapptag);
    lydict_remove(ctx->ctx, must->dsc);
    lydict_remove(ctx->ctx, must->ref);
    FREE_ARRAY(ctx, must->exts, lysc_ext_instance_free);
}